

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcErrorList.cpp
# Opt level: O1

void __thiscall GrcErrorList::WriteTableVersionsGenerated(GrcErrorList *this,ostream *strmOut)

{
  int fxdVersion;
  ostream *poVar1;
  string local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>(strmOut,"Table versions generated:\n",0x1a);
  WriteTableDescriptionString(strmOut,ktiSilf);
  WriteTableDescriptionString(strmOut,ktiGloc);
  WriteTableDescriptionString(strmOut,ktiGlat);
  WriteTableDescriptionString(strmOut,ktiFeat);
  WriteTableDescriptionString(strmOut,ktiSill);
  fxdVersion = g_cman.m_fxdCompilerVersion;
  std::__ostream_insert<char,std::char_traits<char>>
            (strmOut,"Minimal compiler version required: ",0x23);
  VersionString_abi_cxx11_(&local_38,fxdVersion);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (strmOut,local_38._M_dataplus._M_p,local_38._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (strmOut,"\n*******************************************************\n\n",0x3a);
  return;
}

Assistant:

void GrcErrorList::WriteTableVersionsGenerated(std::ostream& strmOut)
{
	strmOut << "Table versions generated:\n";

	WriteTableDescriptionString(strmOut, ktiSilf);
	WriteTableDescriptionString(strmOut, ktiGloc);
	WriteTableDescriptionString(strmOut, ktiGlat);
	WriteTableDescriptionString(strmOut, ktiFeat);
	WriteTableDescriptionString(strmOut, ktiSill);

	const int fxd = g_cman.CompilerVersion();
	strmOut << "Minimal compiler version required: " << VersionString(fxd) << "\n";

	strmOut << "\n*******************************************************\n\n";
}